

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::compareEqual<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *lhs,Matrix<double,__1,_1,_0,__1,_1> *rhs)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  
  lVar3 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      lVar3) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                  ,0x74,
                  "Eigen::CwiseBinaryOp<Eigen::numext::equal_to<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::equal_to<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar3 < 1) {
    bVar4 = true;
  }
  else {
    lVar5 = 0;
    do {
      dVar1 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [lVar5];
      dVar2 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [lVar5];
      bVar4 = (bool)(-(dVar1 == dVar2) & 1);
      if (dVar1 != dVar2) {
        return bVar4;
      }
      if (NAN(dVar1) || NAN(dVar2)) {
        return bVar4;
      }
      bVar6 = lVar3 + -1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar6);
  }
  return bVar4;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }